

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeValidJointActions
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,Index jt_bgI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *valid_JAs,BGIP_BnB_NodePtr *node)

{
  int *piVar1;
  uint uVar2;
  sp_counted_base *psVar3;
  Index IVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  reference pvVar6;
  uint agI;
  ulong __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> curr_JA;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valid_action_set;
  allocator_type local_81;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  element_type *local_48;
  shared_count asStack_40 [2];
  
  local_80 = valid_JAs;
  pvVar5 = BayesianGameBase::JointToIndividualTypeIndices
                     (&((this->_m_bgip).px)->super_BayesianGameBase,jt_bgI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,this->_m_nrAgents,
             &BGIP_BnB::UNSPECIFIED_ACTION,(allocator_type *)&local_78);
  agI = 0;
  while( true ) {
    __n = (ulong)agI;
    if (this->_m_nrAgents <= __n) break;
    local_48 = node->px;
    asStack_40[0].pi_ = (node->pn).pi_;
    psVar3 = (node->pn).pi_;
    uVar2 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[__n];
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar3->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    IVar4 = *(Index *)(*(long *)&(this->_m_depthFirstSpecified).
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[__n].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + (ulong)uVar2 * 4);
    boost::detail::shared_count::~shared_count(asStack_40);
    if (IVar4 <= node->px->_m_depth) {
      IVar4 = BGIP_BnB_Node::GetSpecifiedAction(node->px,agI,IVar4);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,__n);
      *pvVar6 = IVar4;
    }
    agI = agI + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,this->_m_nrAgents,
             &local_81);
  GenerateJointActions
            (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,local_80,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  return;
}

Assistant:

void 
    ComputeValidJointActions(
            Index jt_bgI, 
            std::vector<Index>& valid_JAs,
            BGIP_BnB_NodePtr node){
    const std::vector<Index> &indTypes=
        _m_bgip->JointToIndividualTypeIndices(jt_bgI);

#if DEBUG_VALID_ACTIONS            
    std::cout << "\tComputing valid JAs for indTypes=" <<
        SoftPrintVector(indTypes) << std::endl;
#endif

    //  valid_action_set[agI] stores the valid action for agent i
    std::vector< Index > valid_action_set(_m_nrAgents, UNSPECIFIED_ACTION);
    for(Index agI=0; agI < _m_nrAgents; agI++)
    {
        Index tI = indTypes[agI];
#if CACHE_IMPLIED_JPOL
        valid_action_set.at(agI) = _m_impliedJPol.at(agI).at(tI);
#else            
        //should be pre-computed with the ordering:
        Index depth_tI = GetDepthFirstSpecified(agI,tI,node);
        Index depth_node = node->GetDepth(); //this node's depth
#if DEBUG_VALID_ACTIONS            
        std::cout << "\tagent "<<agI<<"'s type ( tI="<<tI
                  <<" ) is first specified at depth_tI "<< depth_tI << std::endl;
        std::cout << "\tthis node's depth_node is " << depth_node << std::endl;
#endif
        if( depth_tI <= depth_node )
            //when depth_tI == depth_node, then *this* node specifies the 
            //action for tI. This means that the valid joint actions that 
            //can be assigned to children nodes of this node, are 
            //constrained!
            valid_action_set.at(agI) = node->GetSpecifiedAction(agI, depth_tI);
        else
        {
            ;
            //we do nothing because
            //  valid_action_set[agI] = {1,...,GetNrActions(agI) }
            //is encoded by valid_action_set[agI] = UNSPECIFIED_ACTION
            //(which is set already)
        }
#endif
#if DEBUG_VALID_ACTIONS            
        std::cout <<"\tvalid action for agI "<<agI<<" is " << 
            valid_action_set.at(agI) << std::endl;
#endif
    }
    std::vector<Index> curr_JA(_m_nrAgents);
    GenerateJointActions(valid_action_set,curr_JA, valid_JAs, 0);
#if DEBUG_VALID_ACTIONS            
    std::cout <<"Generated the following valid_JAs:"<<SoftPrintVector(valid_JAs)<<endl;
#endif
    //return(valid_JAs);
}